

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O3

void __thiscall NDeviceChannel::NDeviceChannel(NDeviceChannel *this)

{
  (this->super_NetworkDataType)._vptr_NetworkDataType = (_func_int **)&PTR__NDeviceChannel_002e7550;
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)&this->id,0,(char *)0x0,0x283c59);
  this->startByte = -1;
  this->startBit = -1;
  this->type = -1;
  this->interleavedDataByte = -1;
  this->interleavedDataBit = -1;
  return;
}

Assistant:

NDeviceChannel::NDeviceChannel() : NetworkDataType() {
    id = "";
    startByte = -1;
    startBit = -1;
    type = -1;
    interleavedDataByte = -1;
    interleavedDataBit = -1;
}